

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

int __thiscall ncnn::PriorBox::load_param(PriorBox *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *in_stack_fffffffffffffe30;
  Mat *this_00;
  Mat *in_stack_fffffffffffffe38;
  Mat *this_01;
  Mat *this_02;
  Mat local_1a0 [2];
  Mat local_120 [2];
  Mat local_90 [2];
  Mat *local_10;
  
  this_02 = local_90;
  local_10 = in_RSI;
  ncnn::Mat::Mat(this_02);
  iVar1 = (int)((ulong)in_RSI >> 0x20);
  ParamDict::get((ParamDict *)this_02,iVar1,in_RDI);
  ncnn::Mat::operator=(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  ncnn::Mat::~Mat((Mat *)0x1eda36);
  ncnn::Mat::~Mat((Mat *)0x1eda43);
  this_01 = local_10;
  ncnn::Mat::Mat(local_120);
  ParamDict::get((ParamDict *)this_02,iVar1,in_RDI);
  ncnn::Mat::operator=(this_01,in_stack_fffffffffffffe30);
  ncnn::Mat::~Mat((Mat *)0x1edaa8);
  ncnn::Mat::~Mat((Mat *)0x1edab5);
  this_00 = local_1a0;
  ncnn::Mat::Mat(this_00);
  ParamDict::get((ParamDict *)this_02,iVar1,in_RDI);
  ncnn::Mat::operator=(this_01,this_00);
  ncnn::Mat::~Mat((Mat *)0x1edb0c);
  ncnn::Mat::~Mat((Mat *)0x1edb16);
  fVar2 = ParamDict::get((ParamDict *)local_10,3,0.1);
  *(float *)&in_RDI[5].cstep = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,4,0.1);
  *(float *)((long)&in_RDI[5].cstep + 4) = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,5,0.2);
  *(float *)&in_RDI[6].data = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,6,0.2);
  *(float *)((long)&in_RDI[6].data + 4) = fVar2;
  iVar1 = ParamDict::get((ParamDict *)local_10,7,1);
  *(int *)&in_RDI[6].refcount = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_10,8,0);
  *(int *)((long)&in_RDI[6].refcount + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_10,9,0);
  *(int *)&in_RDI[6].elemsize = iVar1;
  iVar1 = ParamDict::get((ParamDict *)local_10,10,0);
  *(int *)((long)&in_RDI[6].elemsize + 4) = iVar1;
  fVar2 = ParamDict::get((ParamDict *)local_10,0xb,-233.0);
  in_RDI[6].elempack = (int)fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,0xc,-233.0);
  *(float *)&in_RDI[6].field_0x1c = fVar2;
  fVar2 = ParamDict::get((ParamDict *)local_10,0xd,0.0);
  *(float *)&in_RDI[6].allocator = fVar2;
  iVar1 = ParamDict::get((ParamDict *)local_10,0xe,0);
  *(bool *)((long)&in_RDI[6].allocator + 4) = iVar1 != 0;
  iVar1 = ParamDict::get((ParamDict *)local_10,0xf,0);
  *(bool *)((long)&in_RDI[6].allocator + 5) = iVar1 != 0;
  return 0;
}

Assistant:

int PriorBox::load_param(const ParamDict& pd)
{
    min_sizes = pd.get(0, Mat());
    max_sizes = pd.get(1, Mat());
    aspect_ratios = pd.get(2, Mat());
    variances[0] = pd.get(3, 0.1f);
    variances[1] = pd.get(4, 0.1f);
    variances[2] = pd.get(5, 0.2f);
    variances[3] = pd.get(6, 0.2f);
    flip = pd.get(7, 1);
    clip = pd.get(8, 0);
    image_width = pd.get(9, 0);
    image_height = pd.get(10, 0);
    step_width = pd.get(11, -233.f);
    step_height = pd.get(12, -233.f);
    offset = pd.get(13, 0.f);
    step_mmdetection = pd.get(14, 0);
    center_mmdetection = pd.get(15, 0);

    return 0;
}